

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O2

Aig_Obj_t * Aig_ObjCreateCi(Aig_Man_t *p)

{
  Aig_Obj_t *Entry;
  
  Entry = Aig_ManFetchMemory(p);
  *(ulong *)&Entry->field_0x18 = *(ulong *)&Entry->field_0x18 & 0xfffffffffffffff8 | 2;
  Vec_PtrPush(p->vCis,Entry);
  p->nObjs[2] = p->nObjs[2] + 1;
  return Entry;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates primary input.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Aig_ObjCreateCi( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    pObj = Aig_ManFetchMemory( p );
    pObj->Type = AIG_OBJ_CI;
    Vec_PtrPush( p->vCis, pObj );
    p->nObjs[AIG_OBJ_CI]++;
    return pObj;
}